

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[37],kj::_::DebugComparison<char,unsigned_char_const&>&,char,unsigned_char_const&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [37],
               DebugComparison<char,_const_unsigned_char_&> *params_1,char *params_2,uchar *params_3
               )

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  uchar *params_00;
  long lVar5;
  String *result;
  String argValues [4];
  size_t in_stack_ffffffffffffff50;
  String local_98 [2];
  String local_68;
  String local_50;
  
  str<char_const(&)[37]>
            (local_98,(kj *)params,(char (*) [37])CONCAT44(in_register_00000014,severity));
  _::operator*(&stack0xffffffffffffff50,params_1);
  cVar1 = *params_2;
  heapString(&local_68,1);
  if ((char *)local_68.content.size_ != (char *)0x0) {
    local_68.content.size_ = (size_t)local_68.content.ptr;
  }
  *(char *)local_68.content.size_ = cVar1;
  str<unsigned_char_const&>(&local_50,(kj *)params_3,params_00);
  argValues_00.size_ = in_stack_ffffffffffffff50;
  argValues_00.ptr = (String *)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)local_98,argValues_00);
  lVar5 = 0x48;
  do {
    lVar2 = *(long *)((long)&local_98[0].content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_98[0].content.size_ + lVar5);
      *(undefined8 *)((long)&local_98[0].content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_98[0].content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_98[0].content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}